

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.capnp.h
# Opt level: O2

void __thiscall capnp::compiler::Token::Builder::setStringLiteral(Builder *this,Reader value)

{
  PointerBuilder local_18;
  
  *(undefined2 *)(this->_builder).data = 1;
  local_18.pointer = (this->_builder).pointers;
  local_18.segment = (this->_builder).segment;
  local_18.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::setBlob<capnp::Text>(&local_18,value);
  return;
}

Assistant:

inline void Token::Builder::setStringLiteral( ::capnp::Text::Reader value) {
  _builder.setDataField<Token::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Token::STRING_LITERAL);
  ::capnp::_::PointerHelpers< ::capnp::Text>::set(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), value);
}